

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-test-macros.c
# Opt level: O0

int run_test_test_macros(void)

{
  int iVar1;
  int iVar2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int i;
  char *c;
  char *b;
  char *a;
  
  iVar1 = test_macros_evil();
  iVar2 = strcmp("ABCDEFGHIJKLMNOPQRSTUVWXYZ","ABCDEFGHIJKLMNOPQRSTUVWXYz");
  if (iVar2 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%s %s %s)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-test-macros.c"
            ,0x25,"a","!=","b","ABCDEFGHIJKLMNOPQRSTUVWXYZ","!=","ABCDEFGHIJKLMNOPQRSTUVWXYz");
    abort();
  }
  iVar2 = strcmp("ABCDEFGHIJKLMNOPQRSTUVWXYZ","ABCDEFGHIJKLMNOPQRSTUVWXYZ");
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%s %s %s)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-test-macros.c"
            ,0x26,"a","==","c","ABCDEFGHIJKLMNOPQRSTUVWXYZ","==","ABCDEFGHIJKLMNOPQRSTUVWXYZ");
    abort();
  }
  iVar2 = test_macros_evil();
  if ((long)(iVar1 + 1) != (long)iVar2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-test-macros.c"
            ,0x27,"i + 1","==","test_macros_evil()",(long)(iVar1 + 1),"==",(long)iVar2);
    abort();
  }
  iVar2 = test_macros_evil();
  if ((long)(iVar1 + 2) != (long)iVar2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-test-macros.c"
            ,0x28,"i + 2","==","test_macros_evil()",(long)(iVar1 + 2),"==",(long)iVar2);
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(test_macros) {
  char* a = "ABCDEFGHIJKLMNOPQRSTUVWXYZ";
  char* b = "ABCDEFGHIJKLMNOPQRSTUVWXYz";
  char* c = "ABCDEFGHIJKLMNOPQRSTUVWXYZ";
  int i;

  i = test_macros_evil();
  ASSERT_STR_NE(a, b);
  ASSERT_STR_EQ(a, c);
  ASSERT_EQ(i + 1, test_macros_evil());
  ASSERT_EQ(i + 2, test_macros_evil());
  return 0;
}